

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testColor.cpp
# Opt level: O2

void testColor(void)

{
  double dVar1;
  double dVar2;
  uint __line;
  PackedColor PVar3;
  ostream *poVar4;
  char *__assertion;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  Color4<unsigned_char> local_110;
  C3c in3;
  Color4<double> c4d;
  C3f c3f;
  C4f c4f;
  Color3<double> c3d;
  double dStack_b0;
  Vec3<double> local_a8;
  double local_88;
  float local_80;
  Vec3<double> local_78;
  double local_58;
  double dStack_50;
  Color4<double> local_48;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Testing functions in ImathColor.h & ImathColorAlgo.h");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"rgb2packed -> packed2rgb");
  std::endl<char,std::char_traits<char>>(poVar4);
  in3.super_Vec3<unsigned_char>.x = '4';
  in3.super_Vec3<unsigned_char>.y = 0x80;
  in3.super_Vec3<unsigned_char>.z = 0xfe;
  PVar3 = Imath_3_2::rgb2packed<unsigned_char>(&in3.super_Vec3<unsigned_char>);
  if (((in3.super_Vec3<unsigned_char>.x == (uchar)PVar3) &&
      (in3.super_Vec3<unsigned_char>.y == (uchar)(PVar3 >> 8))) &&
     (in3.super_Vec3<unsigned_char>.z == (uchar)(PVar3 >> 0x10))) {
    local_110.r = '4';
    local_110.g = 0x80;
    local_110.b = 0xfe;
    local_110.a = '\x7f';
    PVar3 = Imath_3_2::rgb2packed<unsigned_char>(&local_110);
    if (((local_110.r == (uchar)PVar3) && (local_110.g == (uchar)(PVar3 >> 8))) &&
       ((local_110.b == (uchar)(PVar3 >> 0x10) && (local_110.a == (uchar)(PVar3 >> 0x18))))) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Imath::Color4 * f");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"Imath::Color4 / f");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"Assignment and comparison");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"rgb2hsv and hsv2rgb");
      std::endl<char,std::char_traits<char>>(poVar4);
      fVar6 = 0.0;
      do {
        if (1.0 < fVar6) {
          for (fVar6 = 0.0; fVar6 <= 1.0; fVar6 = fVar6 + 1.0) {
            for (fVar7 = 0.0; fVar7 <= 1.0; fVar7 = fVar7 + 1.0) {
              fVar9 = 0.0;
              while( true ) {
                if (1.0 < fVar9) break;
                c3f.super_Vec3<float>.x = fVar6;
                c3f.super_Vec3<float>.y = fVar7;
                c3f.super_Vec3<float>.z = fVar9;
                Imath_3_2::rgb2hsv<float>((Imath_3_2 *)&c4d,&c3f.super_Vec3<float>);
                local_88 = c4d.r;
                local_80 = c4d.g._0_4_;
                Imath_3_2::hsv2rgb<float>((Imath_3_2 *)&c4d,(Vec3<float> *)&local_88);
                fVar5 = c4d.r._0_4_ - c3f.super_Vec3<float>.x;
                if (fVar5 <= -fVar5) {
                  fVar5 = -fVar5;
                }
                if (1e-05 < fVar5) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.x, c3f.x, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xda,"void testColor()");
                }
                fVar5 = c4d.r._4_4_ - c3f.super_Vec3<float>.y;
                if (fVar5 <= -fVar5) {
                  fVar5 = -fVar5;
                }
                if (1e-05 < fVar5) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.y, c3f.y, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xdb,"void testColor()");
                }
                fVar5 = c4d.g._0_4_ - c3f.super_Vec3<float>.z;
                if (fVar5 <= -fVar5) {
                  fVar5 = -fVar5;
                }
                if (1e-05 < fVar5) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.z, c3f.z, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xdc,"void testColor()");
                }
                fVar9 = fVar9 + 1.0;
              }
            }
          }
          dVar2 = 0.0;
          do {
            if (1.0 < dVar2) {
              dVar2 = 0.0;
              do {
                if (1.0 < dVar2) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
                  std::endl<char,std::char_traits<char>>(poVar4);
                  return;
                }
                for (dVar8 = 0.0; dVar8 <= 1.0; dVar8 = dVar8 + 1.0) {
                  for (dVar10 = 0.0; dVar10 <= 1.0; dVar10 = dVar10 + 1.0) {
                    c3d.super_Vec3<double>.x = dVar2;
                    c3d.super_Vec3<double>.y = dVar8;
                    c3d.super_Vec3<double>.z = dVar10;
                    Imath_3_2::rgb2hsv<double>(&local_a8,&c3d.super_Vec3<double>);
                    local_78.x = local_a8.x;
                    local_78.y = local_a8.y;
                    local_78.z = local_a8.z;
                    Imath_3_2::hsv2rgb<double>(&local_a8,&local_78);
                    dVar1 = local_a8.x - c3d.super_Vec3<double>.x;
                    if (dVar1 <= -dVar1) {
                      dVar1 = -dVar1;
                    }
                    if (9.999999747378752e-06 < dVar1) {
                      __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.x, c3d.x, 1e-5f)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                    ,0x101,"void testColor()");
                    }
                    dVar1 = local_a8.y - c3d.super_Vec3<double>.y;
                    if (dVar1 <= -dVar1) {
                      dVar1 = -dVar1;
                    }
                    if (9.999999747378752e-06 < dVar1) {
                      __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.y, c3d.y, 1e-5f)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                    ,0x102,"void testColor()");
                    }
                    dVar1 = local_a8.z - c3d.super_Vec3<double>.z;
                    if (dVar1 <= -dVar1) {
                      dVar1 = -dVar1;
                    }
                    if (9.999999747378752e-06 < dVar1) {
                      __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.z, c3d.z, 1e-5f)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                    ,0x103,"void testColor()");
                    }
                  }
                }
                dVar2 = dVar2 + 1.0;
              } while( true );
            }
            for (dVar8 = 0.0; dVar8 <= 1.0; dVar8 = dVar8 + 1.0) {
              for (dVar10 = 0.0; dVar10 <= 1.0; dVar10 = dVar10 + 1.0) {
                c4d.a = 1.0;
                c4d.r = dVar2;
                c4d.g = dVar8;
                c4d.b = dVar10;
                Imath_3_2::rgb2hsv<double>((Color4<double> *)&c3d,&c4d);
                local_48.r = c3d.super_Vec3<double>.x;
                local_48.g = c3d.super_Vec3<double>.y;
                local_48.b = c3d.super_Vec3<double>.z;
                Imath_3_2::hsv2rgb<double>((Color4<double> *)&c3d,&local_48);
                dVar1 = c3d.super_Vec3<double>.x - c4d.r;
                if (dVar1 <= -dVar1) {
                  dVar1 = -dVar1;
                }
                if (9.999999747378752e-06 < dVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.r, c4d.r, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xed,"void testColor()");
                }
                dVar1 = c3d.super_Vec3<double>.y - c4d.g;
                if (dVar1 <= -dVar1) {
                  dVar1 = -dVar1;
                }
                if (9.999999747378752e-06 < dVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.g, c4d.g, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xee,"void testColor()");
                }
                dVar1 = c3d.super_Vec3<double>.z - c4d.b;
                if (dVar1 <= -dVar1) {
                  dVar1 = -dVar1;
                }
                if (9.999999747378752e-06 < dVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.b, c4d.b, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xef,"void testColor()");
                }
                dVar1 = dStack_b0 - c4d.a;
                if (dVar1 <= -dVar1) {
                  dVar1 = -dVar1;
                }
                if (9.999999747378752e-06 < dVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.a, c4d.a, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0xf0,"void testColor()");
                }
              }
            }
            dVar2 = dVar2 + 1.0;
          } while( true );
        }
        for (fVar7 = 0.0; fVar7 <= 1.0; fVar7 = fVar7 + 1.0) {
          fVar9 = 0.0;
          while( true ) {
            if (1.0 < fVar9) break;
            c4f.a = 1.0;
            c4f.r = fVar6;
            c4f.g = fVar7;
            c4f.b = fVar9;
            Imath_3_2::rgb2hsv<float>((Imath_3_2 *)&c4d,&c4f);
            local_58 = c4d.r;
            dStack_50 = c4d.g;
            Imath_3_2::hsv2rgb<float>((Imath_3_2 *)&c4d,(Color4<float> *)&local_58);
            fVar5 = c4d.r._0_4_ - c4f.r;
            if (fVar5 <= -fVar5) {
              fVar5 = -fVar5;
            }
            if (1e-05 < fVar5) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.r, c4f.r, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,199,"void testColor()");
            }
            fVar5 = c4d.r._4_4_ - c4f.g;
            if (fVar5 <= -fVar5) {
              fVar5 = -fVar5;
            }
            if (1e-05 < fVar5) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.g, c4f.g, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,200,"void testColor()");
            }
            fVar5 = c4d.g._0_4_ - c4f.b;
            if (fVar5 <= -fVar5) {
              fVar5 = -fVar5;
            }
            if (1e-05 < fVar5) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.b, c4f.b, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xc9,"void testColor()");
            }
            fVar5 = c4d.g._4_4_ - c4f.a;
            if (fVar5 <= -fVar5) {
              fVar5 = -fVar5;
            }
            if (1e-05 < fVar5) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.a, c4f.a, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xca,"void testColor()");
            }
            fVar9 = fVar9 + 1.0;
          }
        }
        fVar6 = fVar6 + 1.0;
      } while( true );
    }
    __assertion = "A == B";
    __line = 0x38;
  }
  else {
    __assertion = "in3 == out3";
    __line = 0x27;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                ,__line,"void testColor()");
}

Assistant:

void
testColor ()
{
    cout << "Testing functions in ImathColor.h & ImathColorAlgo.h" << endl;

    cout << "rgb2packed -> packed2rgb" << endl;

    const float epsilon = std::numeric_limits<float>::epsilon ();

    IMATH_INTERNAL_NAMESPACE::PackedColor packed;
    IMATH_INTERNAL_NAMESPACE::C3c         in3 (52, 128, 254);
    IMATH_INTERNAL_NAMESPACE::C3c         out3;

    packed = IMATH_INTERNAL_NAMESPACE::rgb2packed (in3);
    IMATH_INTERNAL_NAMESPACE::packed2rgb (packed, out3);

    assert (in3 == out3);

    IMATH_INTERNAL_NAMESPACE::C4c testConstructor1;
    IMATH_INTERNAL_NAMESPACE::C4c testConstructor1i (0);
    IMATH_INTERNAL_NAMESPACE::C4c testConstructor2 (testConstructor1i);

    testConstructor1 =
        testConstructor2; // use these so the compiler doesn't emit a warning

    IMATH_INTERNAL_NAMESPACE::C4c testConstructor3 (52, 128, 254, 127);
    IMATH_INTERNAL_NAMESPACE::C4c A (testConstructor3);
    IMATH_INTERNAL_NAMESPACE::C4c B;
    IMATH_INTERNAL_NAMESPACE::C4f X, Y, tmp;

    packed = IMATH_INTERNAL_NAMESPACE::rgb2packed (A);
    IMATH_INTERNAL_NAMESPACE::packed2rgb (packed, B);

    assert (A == B);

    cout << "Imath::Color4 * f" << endl;

    assert (
        (IMATH_INTERNAL_NAMESPACE::C4f (0.330f, 0.710f, 0.010f, 0.999f) *
         0.999f) ==
        IMATH_INTERNAL_NAMESPACE::C4f (
            0.330f * 0.999f,
            0.710f * 0.999f,
            0.010f * 0.999f,
            0.999f * 0.999f));

    cout << "Imath::Color4 / f" << endl;

    assert (
        (IMATH_INTERNAL_NAMESPACE::C4f (0.330f, 0.710f, 0.010f, 0.999f) /
         0.999f) ==
        IMATH_INTERNAL_NAMESPACE::C4f (
            0.330f / 0.999f,
            0.710f / 0.999f,
            0.010f / 0.999f,
            0.999f / 0.999f));

    cout << "Assignment and comparison" << endl;

    B = A;
    assert (B == A);
    assert (!(B != A));

    X = Y = IMATH_INTERNAL_NAMESPACE::C4f (0.123f, -0.420f, 0.501f, 0.998f);

    X *= 0.001f;

    assert (
        std::fabs ((Y.r * 0.001f) - X.r) <= epsilon &&
        std::fabs ((Y.g * 0.001f) - X.g) <= epsilon &&
        std::fabs ((Y.b * 0.001f) - X.b) <= epsilon &&
        std::fabs ((Y.a * 0.001f) - X.a) <= epsilon);

    X = Y = IMATH_INTERNAL_NAMESPACE::C4f (0.123f, -0.420f, 0.501f, 0.998f);

    X /= -1.001f;

    assert (
        std::fabs ((Y.r / -1.001f) - X.r) <= epsilon &&
        std::fabs ((Y.g / -1.001f) - X.g) <= epsilon &&
        std::fabs ((Y.b / -1.001f) - X.b) <= epsilon &&
        std::fabs ((Y.a / -1.001f) - X.a) <= epsilon);

    Y = IMATH_INTERNAL_NAMESPACE::C4f (0.998f, -0.001f, 0.501f, 1.001f);
    X = IMATH_INTERNAL_NAMESPACE::C4f (0.011f, -0.420f, -0.501f, 0.998f);

    tmp = X + Y;

    assert (
        std::fabs ((X.r + Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g + Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b + Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a + Y.a) - tmp.a) <= epsilon);

    tmp = X - Y;

    assert (
        std::fabs ((X.r - Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g - Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b - Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a - Y.a) - tmp.a) <= epsilon);

    tmp = X * Y;

    assert (
        std::fabs ((X.r * Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g * Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b * Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a * Y.a) - tmp.a) <= epsilon);

    tmp = X / Y;

    //
    // epsilon doesn't work here.
    //
    assert (
        std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f &&
        std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f &&
        std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f &&
        std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f);

    tmp = X;
    tmp += Y;

    assert (
        std::fabs ((X.r + Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g + Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b + Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a + Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp -= Y;

    assert (
        std::fabs ((X.r - Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g - Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b - Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a - Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp *= Y;

    assert (
        std::fabs ((X.r * Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g * Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b * Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a * Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp /= Y;

    //
    // epsilon doesn't work here.
    //
    assert (
        std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f &&
        std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f &&
        std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f &&
        std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f);

    cout << "rgb2hsv and hsv2rgb" << endl;

    // C4f
    
    IMATH_INTERNAL_NAMESPACE::C4f c4f, r4f, tmp4f;

    for (float r=0.0f; r<=1.0; r += 1.0f)
        for (float g=0.0f; g<=1.0; g += 1.0f)
            for (float b=0.0f; b<=1.0; b += 1.0f)
            {
                c4f.r = r;
                c4f.g = g;
                c4f.b = b;
                c4f.a = 1.0f;
                tmp4f = rgb2hsv(c4f);
                r4f = hsv2rgb(tmp4f);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.r, c4f.r, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.g, c4f.g, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.b, c4f.b, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.a, c4f.a, 1e-5f));
            }
    
    // C3f
    
    IMATH_INTERNAL_NAMESPACE::C3f c3f, r3f, tmp3f;

    for (float r=0.0f; r<=1.0; r += 1.0f)
        for (float g=0.0f; g<=1.0; g += 1.0f)
            for (float b=0.0f; b<=1.0; b += 1.0f)
            {
                c3f.x = r;
                c3f.y = g;
                c3f.z = b;
                tmp3f = rgb2hsv(c3f);
                r3f = hsv2rgb(tmp3f);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.x, c3f.x, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.y, c3f.y, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.z, c3f.z, 1e-5f));
            }
    
    // C4d
    
    IMATH_INTERNAL_NAMESPACE::Color4<double> c4d, r4d, tmp4d;

    for (double r=0.0; r<=1.0; r += 1.0)
        for (double g=0.0; g<=1.0; g += 1.0)
            for (double b=0.0; b<=1.0; b += 1.0)
            {
                c4d.r = r;
                c4d.g = g;
                c4d.b = b;
                c4d.a = 1.0;
                tmp4d = rgb2hsv(c4d);
                r4d = hsv2rgb(tmp4d);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.r, c4d.r, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.g, c4d.g, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.b, c4d.b, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.a, c4d.a, 1e-5f));
            }
    

    // C3d
    
    IMATH_INTERNAL_NAMESPACE::Color3<double> c3d, r3d, tmp3d;

    for (double r=0.0; r<=1.0; r += 1.0)
        for (double g=0.0; g<=1.0; g += 1.0)
            for (double b=0.0; b<=1.0; b += 1.0)
            {
                c3d.x = r;
                c3d.y = g;
                c3d.z = b;
                tmp3d = rgb2hsv(c3d);
                r3d = hsv2rgb(tmp3d);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.x, c3d.x, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.y, c3d.y, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.z, c3d.z, 1e-5f));
            }
    
    cout << "ok\n" << endl;
}